

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::TargetCompare::operator()
          (TargetCompare *this,cmGeneratorTarget *l,cmGeneratorTarget *r)

{
  __type _Var1;
  string *psVar2;
  string *__rhs;
  cmGeneratorTarget *r_local;
  cmGeneratorTarget *l_local;
  TargetCompare *this_local;
  
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(r);
  _Var1 = std::operator==(psVar2,&this->First);
  if (_Var1) {
    this_local._7_1_ = false;
  }
  else {
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(l);
    _Var1 = std::operator==(psVar2,&this->First);
    if (_Var1) {
      this_local._7_1_ = true;
    }
    else {
      psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(l);
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_(r);
      this_local._7_1_ = std::operator<(psVar2,__rhs);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGhsMultiGenerator::TargetCompare::operator()(
  cmGeneratorTarget const* l, cmGeneratorTarget const* r) const
{
  // Make sure a given named target is ordered first,
  // e.g. to set ALL_BUILD as the default active project.
  // When the empty string is named this is a no-op.
  if (r->GetName() == this->First) {
    return false;
  }
  if (l->GetName() == this->First) {
    return true;
  }
  return l->GetName() < r->GetName();
}